

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_builtin_type
          (CompilerMSL *this,uint32_t type_id,BuiltIn builtin)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type;
  SPIRType *pSVar2;
  SPIRType *this_00;
  uint32_t id_00;
  
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  if ((builtin - BuiltInLayer < 2) || (builtin == BuiltInFragStencilRefEXT)) {
    if (*(int *)&(type->super_IVariant).field_0xc == 8) {
      return type_id;
    }
  }
  else {
    if (builtin != BuiltInSampleMask) {
      return type_id;
    }
    bVar1 = Compiler::is_array((Compiler *)this,type);
    if (!bVar1) {
      return type_id;
    }
  }
  id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,type->pointer + 1);
  pSVar2 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id);
  *(undefined8 *)&(pSVar2->super_IVariant).field_0xc = 0x2000000008;
  id_00 = id;
  if (type->pointer == true) {
    id_00 = id + 1;
    this_00 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id_00);
    SPIRType::operator=(this_00,pSVar2);
    this_00->pointer = true;
    this_00->storage = type->storage;
    (this_00->parent_type).id = id;
  }
  return id_00;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_builtin_type(uint32_t type_id, BuiltIn builtin)
{
	auto &type = get<SPIRType>(type_id);

	if ((builtin == BuiltInSampleMask && is_array(type)) ||
	    ((builtin == BuiltInLayer || builtin == BuiltInViewportIndex || builtin == BuiltInFragStencilRefEXT) &&
	     type.basetype != SPIRType::UInt))
	{
		uint32_t next_id = ir.increase_bound_by(type.pointer ? 2 : 1);
		uint32_t base_type_id = next_id++;
		auto &base_type = set<SPIRType>(base_type_id);
		base_type.basetype = SPIRType::UInt;
		base_type.width = 32;

		if (!type.pointer)
			return base_type_id;

		uint32_t ptr_type_id = next_id++;
		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = base_type;
		ptr_type.pointer = true;
		ptr_type.storage = type.storage;
		ptr_type.parent_type = base_type_id;
		return ptr_type_id;
	}

	return type_id;
}